

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate-vfp.inc.c
# Opt level: O2

void gen_VNMLS_dp(TCGContext_conflict1 *tcg_ctx,TCGv_i64 vd,TCGv_i64 vn,TCGv_i64 vm,TCGv_ptr fpst)

{
  TCGv_i64 retval;
  uintptr_t o;
  
  retval = tcg_temp_new_i64(tcg_ctx);
  gen_helper_vfp_muld(tcg_ctx,retval,vn,vm,fpst);
  gen_helper_vfp_negd(tcg_ctx,vd,vd);
  gen_helper_vfp_addd(tcg_ctx,vd,vd,retval,fpst);
  tcg_temp_free_internal_aarch64(tcg_ctx,(TCGTemp *)(retval + (long)tcg_ctx));
  return;
}

Assistant:

static void gen_VNMLS_dp(TCGContext *tcg_ctx, TCGv_i64 vd, TCGv_i64 vn, TCGv_i64 vm, TCGv_ptr fpst)
{
    /*
     * VNMLS: -fd + (fn * fm)
     * Note that it isn't valid to replace (-A + B) with (B - A) or similar
     * plausible looking simplifications because this will give wrong results
     * for NaNs.
     */
    TCGv_i64 tmp = tcg_temp_new_i64(tcg_ctx);

    gen_helper_vfp_muld(tcg_ctx, tmp, vn, vm, fpst);
    gen_helper_vfp_negd(tcg_ctx, vd, vd);
    gen_helper_vfp_addd(tcg_ctx, vd, vd, tmp, fpst);
    tcg_temp_free_i64(tcg_ctx, tmp);
}